

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::verifyCurrentVertexAttribIi
               (TestContext *testCtx,CallLogWrapper *gl,GLint index,GLint x,GLint y,GLint z,GLint w)

{
  GLint index_00;
  CallLogWrapper *this;
  qpTestResult qVar1;
  int (*paiVar2) [4];
  TestLog *this_00;
  MessageBuilder *pMVar3;
  MessageBuilder local_1d8;
  undefined1 local_58 [8];
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  GLint z_local;
  GLint y_local;
  GLint x_local;
  GLint index_local;
  CallLogWrapper *gl_local;
  TestContext *testCtx_local;
  
  attribValue.m_postguard[2] = z;
  attribValue.m_postguard[3] = y;
  z_local = x;
  y_local = index;
  _x_local = gl;
  gl_local = (CallLogWrapper *)testCtx;
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
            ((StateQueryMemoryWriteGuard<int[4]> *)local_58);
  this = _x_local;
  index_00 = y_local;
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  glu::CallLogWrapper::glGetVertexAttribIiv(this,index_00,0x8626,*paiVar2);
  deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
            ((StateQueryMemoryWriteGuard<int[4]> *)local_58,(TestContext *)gl_local);
  paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                      ((StateQueryMemoryWriteGuard *)local_58);
  if (((((*paiVar2)[0] != z_local) ||
       (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                  operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
       (*paiVar2)[1] != attribValue.m_postguard[3])) ||
      (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                 operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
      (*paiVar2)[2] != attribValue.m_postguard[2])) ||
     (paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
                operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58),
     (*paiVar2)[3] != w)) {
    this_00 = tcu::TestContext::getLog((TestContext *)gl_local);
    tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_1d8,(char (*) [21])"// ERROR: Expected [");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&z_local);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,attribValue.m_postguard + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&w);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x12a3a8e);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [6])0x12a12dc);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 2);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12ed28e);
    paiVar2 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard::
              operator_cast_to_function_pointer((StateQueryMemoryWriteGuard *)local_58);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,*paiVar2 + 3);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x12a9f4e);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d8);
    qVar1 = tcu::TestContext::getTestResult((TestContext *)gl_local);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((TestContext *)gl_local,QP_TEST_RESULT_FAIL,"got invalid attribute value");
    }
  }
  return;
}

Assistant:

void verifyCurrentVertexAttribIi (tcu::TestContext& testCtx, glu::CallLogWrapper& gl, GLint index, GLint x, GLint y, GLint z, GLint w)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[4]> attribValue;
	gl.glGetVertexAttribIiv(index, GL_CURRENT_VERTEX_ATTRIB, attribValue);

	attribValue.verifyValidity(testCtx);

	if (attribValue[0] != x || attribValue[1] != y || attribValue[2] != z || attribValue[3] != w)
	{
		testCtx.getLog() << TestLog::Message
			<< "// ERROR: Expected [" << x << "," << y << "," << z << "," << w << "];"
			<< "got [" << attribValue[0] << "," << attribValue[1] << "," << attribValue[2] << "," << attribValue[3] << "]"
			<< TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid attribute value");
	}
}